

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculationvisitor.cpp
# Opt level: O2

void __thiscall
CalculationVisitor::visit
          (CalculationVisitor *this,Expression *parent,VariableExpression *expression)

{
  Environment *this_00;
  bool bVar1;
  runtime_error *this_01;
  string sStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  ResultValue value;
  
  ResultValue::ResultValue(&value);
  this_00 = this->mEnvironment;
  VariableExpression::name_abi_cxx11_(&local_78,expression);
  bVar1 = Environment::getVariable(this_00,&local_78,&value,true);
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar1) {
    std::deque<ResultValue,_std::allocator<ResultValue>_>::push_back
              (&(this->mEvaluationStack).c,&value);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  VariableExpression::name_abi_cxx11_(&sStack_d8,expression);
  std::operator+(&local_b8,"\'",&sStack_d8);
  std::operator+(&local_98,&local_b8,
                 "\' is not a defined variable. Type \':help\' for a list of commands.");
  std::runtime_error::runtime_error(this_01,(string *)&local_98);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CalculationVisitor::visit(Expression* parent, VariableExpression* expression) {
	ResultValue value;
	if (mEnvironment.getVariable(expression->name(), value, true)) {
		mEvaluationStack.push(value);
	} else {
		throw std::runtime_error("'" + expression->name() + "' is not a defined variable. Type ':help' for a list of commands.");
	}
}